

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall fasttext::Matrix::load(Matrix *this,istream *in)

{
  allocator_type *__a;
  float *pfVar1;
  char *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  undefined1 *__n;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29 [25];
  char *local_10;
  
  local_10 = in_RSI;
  std::istream::read(in_RSI,(long)(in_RDI + 1));
  std::istream::read(local_10,(long)&in_RDI[1].super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish);
  __a = (allocator_type *)
        ((long)in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start *
        (long)in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish);
  __n = local_29;
  std::allocator<float>::allocator((allocator<float> *)0x17749d);
  std::vector<float,_std::allocator<float>_>::vector(in_stack_ffffffffffffffc0,(size_type)__n,__a);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)__a,in_RDI);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::allocator<float>::~allocator((allocator<float> *)0x1774d6);
  pfVar1 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x1774e9);
  std::istream::read(local_10,(long)pfVar1);
  return;
}

Assistant:

void Matrix::load(std::istream& in) {
  in.read((char*)&m_, sizeof(int64_t));
  in.read((char*)&n_, sizeof(int64_t));
  data_ = std::vector<real>(m_ * n_);
  in.read((char*)data_.data(), m_ * n_ * sizeof(real));
}